

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugLoc::LocationList::dump
          (LocationList *this,raw_ostream *OS,uint64_t BaseAddress,bool IsLittleEndian,
          uint AddressSize,MCRegisterInfo *MRI,DWARFUnit *U,DIDumpOptions DumpOpts,uint Indent)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  ArrayRef<unsigned_char> Data;
  format_object_base local_60;
  long local_50;
  int local_48;
  int local_44;
  long *local_40;
  uint local_38;
  int local_34;
  
  plVar3 = (long *)(this->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
                   super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                   super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                   super_SmallVectorBase.BeginX;
  iVar1 = AddressSize * 2;
  local_38 = (uint)IsLittleEndian;
  local_34 = iVar1;
  for (lVar2 = (ulong)(this->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
                      super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                      super_SmallVectorBase.Size * 0x28; lVar2 != 0; lVar2 = lVar2 + -0x28) {
    raw_ostream::operator<<(OS,'\n');
    raw_ostream::indent(OS,Indent);
    local_50 = *plVar3 + BaseAddress;
    local_60.Fmt = "[0x%*.*lx, ";
    local_60._vptr_format_object_base = (_func_int **)&PTR_home_01127db0;
    local_48 = iVar1;
    local_44 = iVar1;
    local_40 = plVar3;
    raw_ostream::operator<<(OS,&local_60);
    plVar3 = local_40;
    local_50 = local_40[1] + BaseAddress;
    local_60.Fmt = " 0x%*.*lx)";
    local_60._vptr_format_object_base = (_func_int **)&PTR_home_01127db0;
    local_48 = iVar1;
    local_44 = iVar1;
    raw_ostream::operator<<(OS,&local_60);
    raw_ostream::operator<<(OS,": ");
    Data.Length._4_4_ = 0;
    Data._0_12_ = *(undefined1 (*) [12])(plVar3 + 2);
    dumpExpression(OS,Data,SUB41(local_38,0),AddressSize,MRI,U);
    plVar3 = plVar3 + 5;
  }
  return;
}

Assistant:

void DWARFDebugLoc::LocationList::dump(raw_ostream &OS, uint64_t BaseAddress,
                                       bool IsLittleEndian,
                                       unsigned AddressSize,
                                       const MCRegisterInfo *MRI, DWARFUnit *U,
                                       DIDumpOptions DumpOpts,
                                       unsigned Indent) const {
  for (const Entry &E : Entries) {
    OS << '\n';
    OS.indent(Indent);
    OS << format("[0x%*.*" PRIx64 ", ", AddressSize * 2, AddressSize * 2,
                 BaseAddress + E.Begin);
    OS << format(" 0x%*.*" PRIx64 ")", AddressSize * 2, AddressSize * 2,
                 BaseAddress + E.End);
    OS << ": ";

    dumpExpression(OS, E.Loc, IsLittleEndian, AddressSize, MRI, U);
  }
}